

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O3

int nghttp2_map_remove(nghttp2_map *map,nghttp2_map_key_type key)

{
  uint uVar1;
  char cVar2;
  void *pvVar3;
  nghttp2_map_key_type nVar4;
  nghttp2_map_bucket *pnVar5;
  ulong uVar6;
  nghttp2_map_bucket *pnVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint32_t uVar11;
  void **ppvVar12;
  
  cVar2 = (char)map->tablelenbits;
  uVar10 = (ulong)((uint)(key * -0x61c88647) >> (-cVar2 & 0x1fU));
  pnVar5 = map->table;
  if (pnVar5[uVar10].data == (void *)0x0) {
    return -0x1f5;
  }
  uVar11 = map->tablelen;
  uVar1 = uVar11 - 1;
  uVar6 = 0xffffffffffffffff;
  while( true ) {
    pnVar7 = pnVar5 + uVar10;
    iVar9 = (int)uVar10;
    uVar6 = uVar6 + 1;
    if ((iVar9 - (pnVar7->hash >> (0x20U - cVar2 & 0x1f)) & uVar1) < uVar6) {
      return -0x1f5;
    }
    if (pnVar7->key == key) break;
    uVar10 = (ulong)(iVar9 + 1U & uVar1);
    if (pnVar5[uVar10].data == (void *)0x0) {
      return -0x1f5;
    }
  }
  uVar6 = (ulong)(uVar1 & iVar9 + 1U);
  pnVar7->hash = 0;
  pnVar7->key = 0;
  pnVar7->data = (void *)0x0;
  if (pnVar5[uVar6].data != (void *)0x0) {
    pnVar7 = pnVar5 + uVar6;
    ppvVar12 = &pnVar5[uVar6].data;
    do {
      if (((int)uVar6 - (pnVar7->hash >> (-(char)map->tablelenbits & 0x1fU)) & uVar11 - 1) == 0)
      break;
      nVar4 = pnVar7->key;
      pvVar3 = pnVar7->data;
      pnVar5 = pnVar5 + uVar10;
      pnVar5->hash = pnVar7->hash;
      pnVar5->key = nVar4;
      pnVar5->data = pvVar3;
      pnVar7->hash = 0;
      pnVar7->key = 0;
      *ppvVar12 = (void *)0x0;
      uVar11 = map->tablelen;
      uVar8 = (ulong)(uVar11 - 1 & (int)uVar6 + 1U);
      pnVar5 = map->table;
      pnVar7 = pnVar5 + uVar8;
      ppvVar12 = &pnVar5[uVar8].data;
      uVar10 = uVar6;
      uVar6 = uVar8;
    } while (*ppvVar12 != (void *)0x0);
  }
  map->size = map->size - 1;
  return 0;
}

Assistant:

int nghttp2_map_remove(nghttp2_map *map, nghttp2_map_key_type key) {
  uint32_t h = hash(key);
  size_t idx = h2idx(h, map->tablelenbits), didx;
  nghttp2_map_bucket *bkt;
  size_t d = 0;

  for (;;) {
    bkt = &map->table[idx];

    if (bkt->data == NULL ||
        d > distance(map->tablelen, map->tablelenbits, bkt, idx)) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    if (bkt->key == key) {
      map_bucket_set_data(bkt, 0, 0, NULL);

      didx = idx;
      idx = (idx + 1) & (map->tablelen - 1);

      for (;;) {
        bkt = &map->table[idx];
        if (bkt->data == NULL ||
            distance(map->tablelen, map->tablelenbits, bkt, idx) == 0) {
          break;
        }

        map->table[didx] = *bkt;
        map_bucket_set_data(bkt, 0, 0, NULL);
        didx = idx;

        idx = (idx + 1) & (map->tablelen - 1);
      }

      --map->size;

      return 0;
    }

    ++d;
    idx = (idx + 1) & (map->tablelen - 1);
  }
}